

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

int __thiscall
QPDFWriter::compareVersions(QPDFWriter *this,int major1,int minor1,int major2,int minor2)

{
  if (major2 <= major1) {
    if (major2 < major1) {
      return 1;
    }
    if (minor2 <= minor1) {
      return (int)(minor2 < minor1);
    }
  }
  return -1;
}

Assistant:

int
QPDFWriter::compareVersions(int major1, int minor1, int major2, int minor2) const
{
    if (major1 < major2) {
        return -1;
    } else if (major1 > major2) {
        return 1;
    } else if (minor1 < minor2) {
        return -1;
    } else if (minor1 > minor2) {
        return 1;
    } else {
        return 0;
    }
}